

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O2

void __thiscall ImGuizmo::vec_t::Transform(vec_t *this,matrix_t *matrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = this->x;
  fVar2 = this->y;
  fVar3 = this->z;
  fVar4 = this->w;
  fVar5 = (matrix->field_0).m[0][1];
  fVar6 = (matrix->field_0).m[0][2];
  fVar7 = (matrix->field_0).m[0][3];
  fVar8 = (matrix->field_0).m[1][1];
  fVar9 = (matrix->field_0).m[1][2];
  fVar10 = (matrix->field_0).m[1][3];
  fVar11 = (matrix->field_0).m[2][1];
  fVar12 = (matrix->field_0).m[2][2];
  fVar13 = (matrix->field_0).m[2][3];
  fVar14 = (matrix->field_0).m[3][1];
  fVar15 = (matrix->field_0).m[3][2];
  fVar16 = (matrix->field_0).m[3][3];
  this->x = fVar4 * (matrix->field_0).m[3][0] +
            fVar3 * (matrix->field_0).m[2][0] +
            fVar1 * (matrix->field_0).m[0][0] + (matrix->field_0).m[1][0] * fVar2;
  this->y = fVar4 * fVar14 + fVar3 * fVar11 + fVar1 * fVar5 + fVar8 * fVar2;
  this->z = fVar4 * fVar15 + fVar3 * fVar12 + fVar1 * fVar6 + fVar9 * fVar2;
  this->w = fVar4 * fVar16 + fVar3 * fVar13 + fVar1 * fVar7 + fVar10 * fVar2;
  return;
}

Assistant:

void vec_t::Transform(const matrix_t& matrix)
   {
      vec_t out;

      out.x = x * matrix.m[0][0] + y * matrix.m[1][0] + z * matrix.m[2][0] + w * matrix.m[3][0];
      out.y = x * matrix.m[0][1] + y * matrix.m[1][1] + z * matrix.m[2][1] + w * matrix.m[3][1];
      out.z = x * matrix.m[0][2] + y * matrix.m[1][2] + z * matrix.m[2][2] + w * matrix.m[3][2];
      out.w = x * matrix.m[0][3] + y * matrix.m[1][3] + z * matrix.m[2][3] + w * matrix.m[3][3];

      x = out.x;
      y = out.y;
      z = out.z;
      w = out.w;
   }